

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O3

void GetOperand(char *oper,OpConfig *op,int pcconv)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  byte bVar7;
  long lVar8;
  byte *pbVar9;
  int iVar10;
  int iVar11;
  undefined1 *puVar12;
  long lVar13;
  char tempop [128];
  char UCoper [128];
  undefined8 uStack_140;
  byte local_138;
  byte local_137;
  char local_136;
  undefined4 local_b8;
  
  pbVar9 = &local_138;
  op->Defn = 0;
  op->Mode = 0;
  op->Value = 0;
  op->X = 0;
  op->Single = 0;
  op->Hunk = 0x7fff;
  bVar1 = *oper;
  if (bVar1 == 0) {
    return;
  }
  lVar13 = 0;
  bVar7 = bVar1;
  do {
    lVar4 = lVar13;
    *(byte *)((long)&local_b8 + lVar4) = bVar7 & 0xdf;
    bVar7 = oper[lVar4 + 1];
    lVar13 = lVar4 + 1;
  } while (bVar7 != 0);
  *(undefined1 *)((long)&local_b8 + lVar4 + 1) = 0;
  if (bVar1 == 0x23) {
    pcVar5 = oper + 1;
    if (oper[1] == '~') {
      pcVar5 = oper + 2;
    }
    uStack_140 = 0x1099cd;
    uVar3 = GetValue(pcVar5,op->Loc + 1);
    op->Value = uVar3;
    op->Mode = 0xc;
    lVar13 = Hunk2;
    op->Hunk = Hunk2;
    op->Defn = DefLine2;
    op->Single = SingleFlag;
    if (oper[1] != '~') {
      return;
    }
    if (lVar13 != 0x7fff) {
      uStack_140 = 0x109a21;
      Error(op->Loc + 2,0xc);
      op->Hunk = 0x7fff;
      uVar3 = op->Value;
    }
    uVar3 = ~uVar3;
    op->Value = uVar3;
    if (Size == 2) {
      uVar3 = uVar3 & 0xffff;
    }
    else {
      if (Size != 1) {
        return;
      }
      uVar3 = uVar3 & 0xff;
    }
LAB_00109ae8:
    op->Value = uVar3;
    return;
  }
  iVar11 = (int)lVar13;
  uStack_140 = 0x109a60;
  iVar10 = iVar11;
  uVar2 = IsRegister(oper,iVar11);
  if (-1 < (int)uVar2) {
    op->Mode = 2 - (uint)((uVar2 & 8) == 0);
    uVar2 = uVar2 & 7;
    goto LAB_00109a7a;
  }
  if (uVar2 == 0xfffffffe) {
    op->Mode = 0xd;
    uVar3 = Sym->Val;
    goto LAB_00109ae8;
  }
  if (*oper == '-') {
    if ((oper[lVar4] != ')') || (oper[1] != '(')) goto LAB_00109b61;
    iVar10 = (int)lVar4 + -2;
    uStack_140 = 0x109b19;
    uVar2 = IsRegister(oper + 2,iVar10);
    if ((uVar2 & 0xfffffff8) == 8) {
      op->Mode = 5;
LAB_00109b2e:
      uVar2 = uVar2 - 8;
LAB_00109a7a:
      op->Rn = uVar2;
      return;
    }
    if (0 < (int)uVar2) {
LAB_00109bb8:
      iVar10 = op->Loc;
      iVar11 = 8;
      goto LAB_00109bc0;
    }
  }
  else {
    if (*oper == '(') {
      if (oper[lVar4] == '+') {
        if (oper[lVar4 + -1] == ')') {
          op->Mode = 4;
          uStack_140 = 0x109b5c;
          uVar2 = GetAReg(oper + 1,iVar11 + -3,op->Loc + 1);
          goto LAB_00109a7a;
        }
      }
      else if (oper[lVar4] == ')') {
        iVar10 = (int)lVar4 + -1;
        uStack_140 = 0x109ace;
        uVar2 = IsRegister(oper + 1,iVar10);
        if ((uVar2 & 0xfffffff8) == 8) {
          op->Mode = 3;
          goto LAB_00109b2e;
        }
        if (uVar2 != 0xffffffff) goto LAB_00109bb8;
        goto LAB_00109bda;
      }
    }
LAB_00109b61:
    if (local_b8._2_1_ == '\0' && (short)local_b8 == 0x5253) {
      op->Mode = 0xe;
      return;
    }
    if (local_b8 == 0x505355) {
      op->Mode = 0x10;
      return;
    }
    if (local_b8 == 0x524343) {
      op->Mode = 0xf;
      return;
    }
  }
LAB_00109bda:
  if (oper[lVar4] == ')') {
    do {
      lVar8 = lVar13;
      lVar13 = lVar8 + -1;
      if (lVar13 < 2) break;
    } while (oper[lVar8 + -2] != '(');
    if (1 < lVar13) {
      if (lVar13 == 2) {
        if (*oper != '-') goto LAB_00109dac;
      }
      else if (oper[lVar8 + -3] == '*') {
        uStack_140 = 0x109d79;
        iVar11 = IsOperator(oper + lVar8 + -4);
        if ((iVar11 != 0) && (oper[lVar8 + -4] != ')')) {
LAB_00109dac:
          oper[lVar8 + -2] = '\0';
          uStack_140 = 0x109dc1;
          lVar4 = GetValue(oper,op->Loc);
          op->Value = lVar4;
          op->Hunk = Hunk2;
          op->Defn = DefLine2;
          oper[lVar8 + -2] = '(';
          iVar10 = op->Loc;
          uStack_140 = 0x109df3;
          pcVar5 = GetField(oper + lVar13,(char *)&local_138);
          if (*pcVar5 == '\0') {
            uStack_140 = 0x109e03;
            sVar6 = strlen((char *)&local_138);
            *(undefined1 *)((long)&uStack_140 + sVar6 + 7) = 0;
          }
          if (((local_136 == '\0') && ((local_138 & 0xdf) == 0x50)) && ((local_137 & 0xdf) == 0x43))
          {
            op->Mode = 10;
            if (op->Hunk == CurrHunk) {
              op->Value = op->Value - (pcconv + AddrCnt);
              op->Hunk = 0x7fff;
            }
          }
          else {
            if (((op->Value != 0) || (op->Hunk != 0x7fff)) ||
               ((LineCount <= op->Defn || (iVar11 = 3, (AdrModeA & 0x4000U) != 0 || NoOpt != 0)))) {
              iVar11 = 6;
            }
            op->Mode = iVar11;
            uStack_140 = 0x109ea8;
            sVar6 = strlen((char *)&local_138);
            uStack_140 = 0x109eb5;
            iVar10 = GetAReg((char *)&local_138,(int)sVar6,iVar10 + (int)lVar13);
            op->Rn = iVar10;
          }
          if (*pcVar5 != '\0') {
            op->Mode = (uint)(op->Mode == 10) * 4 + 7;
            if (*pcVar5 != ',') {
              uStack_140 = 0x109ee8;
              Error(op->Loc,8);
            }
            iVar10 = (op->Loc + (int)(pcVar5 + 1)) - (uint)oper;
            uStack_140 = 0x109f02;
            pcVar5 = GetField(pcVar5 + 1,(char *)&local_138);
            uStack_140 = 0x109f0d;
            sVar6 = strlen((char *)&local_138);
            if (*pcVar5 == '\0') {
              *(undefined1 *)((long)&uStack_140 + sVar6 + 7) = 0;
              pbVar9 = (byte *)((long)&uStack_140 + 7);
            }
            else {
              uStack_140 = 0x109f27;
              Error(iVar10,8);
            }
            puVar12 = pbVar9 + sVar6;
            if ((puVar12 + -2 < &local_138) || (puVar12[-2] != '.')) {
              op->Xsize = 2;
              iVar11 = (int)puVar12 + 1;
            }
            else {
              iVar11 = (int)puVar12 + -1;
              puVar12[-2] = 0;
              if ((puVar12[-1] & 0xdf) == 0x4c) {
                op->Xsize = 4;
              }
              else {
                if ((puVar12[-1] & 0xdf) != 0x57) {
                  uStack_140 = 0x10a004;
                  Error(~(uint)oper + (int)pcVar5 + op->Loc,9);
                }
                op->Xsize = 2;
              }
            }
            uStack_140 = 0x10a02c;
            uVar2 = IsRegister((char *)&local_138,iVar11 + ~(uint)&local_138);
            op->Xn = uVar2 & 7;
            if (uVar2 < 8) {
              op->X = 1;
            }
            else if ((uVar2 & 0xfffffff8) == 8) {
              op->X = 2;
            }
            else {
              uStack_140 = 0x10a05f;
              Error(iVar10,8);
            }
          }
          if (op->Hunk == 0x7fff || op->Hunk < 0) {
            return;
          }
          uStack_140 = 0x10a087;
          Error(op->Loc,0xc);
          return;
        }
      }
      else {
        uStack_140 = 0x109d9c;
        iVar11 = IsOperator(oper + lVar8 + -3);
        if ((iVar11 == 0) || (oper[lVar8 + -3] == ')')) goto LAB_00109dac;
      }
    }
  }
  uStack_140 = 0x109c17;
  iVar10 = GetMultReg(oper,iVar10);
  if (iVar10 != 0) {
    op->Value = (long)iVar10;
    op->Mode = 0xd;
    return;
  }
  if ((((*oper == '(') && (oper[lVar4 + -2] == ')')) && (oper[lVar4 + -1] == '.')) &&
     (((oper[lVar4] & 0xdfU) == 0x57 || ((oper[lVar4] & 0xdfU) == 0x4c)))) {
    oper[lVar4 + -1] = '\0';
    uStack_140 = 0x109c66;
    lVar13 = GetValue(oper,op->Loc);
    op->Value = lVar13;
    op->Hunk = Hunk2;
    op->Defn = DefLine2;
    op->Single = SingleFlag;
    op->Mode = (oper[lVar4] & 0xdfU) == 0x57 ^ 9;
    oper[lVar4 + -1] = '.';
    return;
  }
  uStack_140 = 0x109cb9;
  uVar3 = GetValue(oper,op->Loc);
  op->Value = uVar3;
  lVar13 = Hunk2;
  op->Hunk = Hunk2;
  iVar11 = DefLine2;
  op->Defn = DefLine2;
  op->Single = SingleFlag;
  op->Mode = 9;
  iVar10 = SmallData;
  if (NoOpt != 0) {
    return;
  }
  if (iVar11 < LineCount) {
    if (lVar13 < 0) {
      return;
    }
    if (lVar13 == CurrHunk) {
      if (pcconv == 0) {
        return;
      }
      lVar13 = uVar3 - (pcconv + AddrCnt);
      if ((short)lVar13 != lVar13) {
        return;
      }
      op->Mode = 10;
    }
    else {
      if (lVar13 == 0x7fff) {
        if ((long)(short)uVar3 != uVar3) {
          return;
        }
        goto LAB_0010a116;
      }
      if (0xffff < uVar3 || SmallData == -1) {
        return;
      }
      op->Mode = 6;
      op->Rn = iVar10;
      lVar13 = uVar3 - DataOffset;
    }
    op->Value = lVar13;
  }
  else {
    if (SmallData == -1) {
      return;
    }
    if ((AdrModeA & 0x20U) != 0) {
      return;
    }
    if (Pass2 != 0) {
      if (-1 < lVar13) {
        if (lVar13 == CurrHunk) {
          op->Mode = 10;
          lVar13 = uVar3 - (pcconv + AddrCnt);
          op->Value = lVar13;
          op->Hunk = 0x7fff;
          if ((pcconv != 0) && (0xfffffffffffeffff < lVar13 - 0x8000U)) {
            return;
          }
        }
        else {
          if (lVar13 == 0x7fff) {
            op->Mode = 8;
          }
          else {
            op->Mode = 6;
            op->Rn = iVar10;
            uVar3 = uVar3 - DataOffset;
            op->Value = uVar3;
          }
          if ((long)(short)uVar3 == uVar3) {
            return;
          }
        }
        iVar10 = op->Loc;
        iVar11 = 0xe;
LAB_00109bc0:
        Error(iVar10,iVar11);
        return;
      }
      uStack_140 = 0x10a116;
      Error(op->Loc,0xe);
LAB_0010a116:
      op->Mode = 8;
      return;
    }
    op->Mode = 6;
    op->Rn = iVar10;
  }
  op->Hunk = 0x7fff;
  return;
}

Assistant:

void 
GetOperand (char *oper, register struct OpConfig *op, int pcconv)
/* Finds mode and value for source or destination operand.
 If PC-relative addressing is permitted, "pcconv" gives the
 offset to the displacement word; otherwise "pcconv" is zero. */
{
	register char *s, *t;
	register int i;
	char *opend;
	char UCoper[MAXLINE], tempop[MAXLINE];
	int rloc;
	long templong;

	op->Value = op->Defn = 0;
	op->Mode = Null;
	op->X = X0;
	op->Hunk = ABSHUNK;
	op->Single = FALSE;

	if (*oper == '\0')
		return; /* There is nothing to process. */

	s = oper;
	t = UCoper;
	while (*s) {
#ifdef FASTTOUPPER
		*t++ = *s & (~ (1<<5)); /* Upper-case version */
#else
		*t++ = toupper(*s); /* Upper-case version */
#endif
		s++;
	}
	*t = '\0';
	opend = s - 1; /* Last character of operand */

	if (*oper == '#') { /* Immediate */
		s = oper + 1; /* The value starts here. */
		if (*s == '~')
			s++; /* Skip over unary NOT. */
		op->Value = GetValue(s, (op->Loc) + 1);
		op->Mode = Imm;
		op->Hunk = Hunk2;
		op->Defn = DefLine2;
		op->Single = SingleFlag;
		if (*(oper + 1) == '~') { /* Unary NOT of entire value */
			if (Hunk2 != ABSHUNK) {
				Error(op->Loc + 2, RelErr);
				op->Hunk = ABSHUNK; /* Must be absolute! */
			}
			op->Value = ~(op->Value); /* Flip all bits. */
			if (Size == Byte)
				op->Value &= 0xFFL; /* Trim to 8 bits. */
			else if (Size == Word)
				op->Value &= 0xFFFFL; /* Trim to 16 bits. */
		}
		return;
	}

	i = IsRegister(oper, opend - oper + 1);
	if (i >= 0) {
		op->Mode = (i & 8) ? ARDir : DReg; /* Register type */
		op->Rn = i & 7; /* Register number */
		return;
	} else if (i == -2) {
		op->Mode = MultiM; /* Equated register list */
		op->Value = Sym->Val;
		return;
	} else if ((*oper == '(') && (*opend == ')')) {
		i = IsRegister(oper + 1, opend - oper - 1);
		if (i >= 8 && i <= 15) {
			op->Mode = ARInd; /* Address Register indirect */
			op->Rn = i - 8;
			return;
		} else if (i != -1) {
			Error(op->Loc, AddrErr); /* Data register is invalid! */
			return;
		} /* else may be parenthesized expression */
	} else if ((*oper == '(') /* Post-increment */
	&& (*opend == '+') && (*(opend - 1) == ')')) {
		op->Mode = ARPost;
		op->Rn = GetAReg(oper + 1, opend - oper - 2, op->Loc + 1);
		return;
	} else if ((*oper == '-') /* Pre-decrement */
	&& (*opend == ')') && (*(oper + 1) == '(')) {
		i = IsRegister(oper + 2, opend - oper - 2);
		if (i >= 8 && i <= 15) {
			op->Mode = ARPre;
			op->Rn = i - 8;
			return;
		} else if (i > 0) {
			Error(op->Loc, AddrErr); /* Data register is invalid! */
			return;
		} /* else parenthesized expression with leading minus? */
	} else if (strcmp(UCoper, "SR") == 0) {
		op->Mode = SR; /* Status Register */
		return;
	} else if (strcmp(UCoper, "CCR") == 0) {
		op->Mode = CCR; /* Condition Code Register */
		return;
	} else if (strcmp(UCoper, "USP") == 0) {
		op->Mode = USP; /* User Stack Pointer */
		return;
	}

	/* Try to split off displacement (if present).
	 We'll assume we have a register expression if the operand
	 ends with a parenthesized expression not preceded by an
	 operator.  I know this code is a real kludge, but that's
	 the result of the bloody syntax.  Thanks, Motorola.	*/

	s = opend; /* Last character */
	if ((i = (*s == ')'))) /* Trailing parenthesis? */
		while (*(--s) != '(') /* Find left parenthesis. */
			if (s <= oper)
				break;
	if (s <= oper) /* Must not be at beginning. */
		i = FALSE;
	if (i) {
		if (s == (oper + 1)) {
			if (*oper == '-')
				i = FALSE; /* Leading minus sign */
		} else {
			t = s - 1;
			if (*t == '*') { /* Location counter? */
				t--;
				if (!IsOperator(t) || (*t == ')'))
					i = FALSE; /* No, it's multiplication. */
			} else if (IsOperator(t) && (*t != ')')) {
				i = FALSE; /* Preceded by an operator */
			}
		}
	}

	if (i) { /* Looks like a displacement mode */
		*s = '\0';
		op->Value = GetValue(oper, op->Loc); /* Displacement */
		op->Hunk = Hunk2; /* Hunk number */
		op->Defn = DefLine2; /* Line where defined */
		*s++ = '('; /* Restore parenthesis. */

		rloc = op->Loc + s - oper; /* The register starts here. */
		s = GetField(s, tempop); /* Get address register. */
		if (*s == '\0') /* If there's no index register, */
			tempop[strlen(tempop) - 1] = '\0'; /* chop off parenthesis. */

		if ((tempop[2] == '\0') && ((tempop[0] & (~ (1<<5))) == 'P')
				&& ((tempop[1] & (~ (1<<5))) == 'C')) {
			op->Mode = PCDisp; /* Program Counter */
			if (op->Hunk == CurrHunk) {
				op->Value -= (AddrCnt + pcconv); /* Adjust displacement. */
				op->Hunk = ABSHUNK;
			}
		} else {
			if ((op->Value == 0) /* If displacement is zero   */
			&& (op->Hunk == ABSHUNK) /*  and is absolute          */
			&& (op->Defn < LineCount) /*  and is already defined   */
			&& !(OpM68R IN AdrModeA) /*  and isn't for a MOVEP    */
			&& !NoOpt) /*  and we can optimize      */
				op->Mode = ARInd; /*  forget the displacement. */
			else
				op->Mode = ARDisp; /* Address reg. w/displacement */
			op->Rn = GetAReg(tempop, strlen(tempop), rloc);
		}
		if (*s != '\0') { /* Index register is present. */
			if (op->Mode == PCDisp)
				op->Mode = PCDisX; /* Program Counter indexed */
			else
				op->Mode = ARDisX; /* Address Register indexed */
			if (*s != ',')
				Error(op->Loc, AddrErr); /* Bad separator */
			s++; /* Skip separator. */
			rloc = op->Loc + s - oper; /* Start of index */
			s = GetField(s, tempop); /* Get index register. */
			t = tempop + strlen(tempop);
			if (*s == '\0')
				*(--t) = '\0'; /* Chop parenthesis. */
			else
				Error(rloc, AddrErr); /* It better be there. */

			t -= 2;
			if ((t < tempop) || (*t != '.')) {
				op->Xsize = Word; /* Size defaults to 16 bits. */
				t += 3;
			} else {
				*t++ = '\0'; /* Chop off size code. */
				//switch (toupper(*t)) {
				switch (*t & (~ (1<<5))) {
				case 'W': /* Word */
					op->Xsize = Word;
					break;
				case 'L': /* Long */
					op->Xsize = Long;
					break;
				default:
					Error(op->Loc + s - 1 - oper, SizeErr); /* Invalid size */
					op->Xsize = Word; /* Make it word for now. */
				}
			}
			i = IsRegister(tempop, t - tempop - 1); /* Get register. */
			op->Xn = i & 7; /* Index register number */
			if ((i >= 0) && (i <= 7))
				op->X = Dreg; /* Data Register */
			else if ((i >= 8) && (i <= 15))
				op->X = Areg; /* Address Register */
			else
				Error(rloc, AddrErr); /* Invalid register */
		}

		if ((op->Hunk >= 0) && (op->Hunk != ABSHUNK))
			Error(op->Loc, RelErr); /*  Relocatable displacement */
		return;
	}

	if ((i = GetMultReg(oper, op->Loc)) != 0) {
		op->Value = (long) i;
		op->Mode = MultiM; /* Register list for MOVEM */
		return;
	}

	if ((*oper == '(') /* Operands of the form (xxxx).W or (xxxx).L */
	&& (*(opend - 2) == ')') && (*(opend - 1) == '.')
			&& (((*opend & (~ (1<<5))) == 'W') || ((*opend & (~ (1<<5))) == 'L'))) {
		*(opend - 1) = '\0'; /* Temporarily cut off length specifier. */
		op->Value = GetValue(oper, op->Loc); /* Get operand value. */
		op->Hunk = Hunk2;
		op->Defn = DefLine2;
		op->Single = SingleFlag;
		if ((*opend & (~ (1<<5))) == 'W')
			op->Mode = AbsW; /* Absolute word */
		else
			op->Mode = AbsL; /* Absolute long */
		*(opend - 1) = '.'; /* Restore original operand. */
		return;
	}

	op->Value = GetValue(oper, op->Loc); /* Plain old expression */
	op->Hunk = Hunk2;
	op->Defn = DefLine2;
	op->Single = SingleFlag;
	op->Mode = AbsL; /* Assume absolute long addressing. */

	if (NoOpt)
		return; /* Do no optimizing. */

	if (DefLine2 < LineCount) { /* Backward reference */

		if (Hunk2 < 0) {
			return; /* External - leave as absolute long. */

		} else if (Hunk2 == CurrHunk) { /* Reference to current hunk */
			if (pcconv) {
				templong = op->Value - (AddrCnt + pcconv); /* PC disp. */
				if ((templong >= -32768) && (templong <= 32767)) {
					op->Mode = PCDisp; /* Convert to PC relative mode. */
					op->Value = templong; /* Adjust displacement. */
					op->Hunk = ABSHUNK;
				}
			}

		} else if (Hunk2 == ABSHUNK) { /* Absolute value */
			if ((op->Value >= -32768) && (op->Value <= 32767))
				op->Mode = AbsW; /* Absolute word */

		} else if ((SmallData != -1) && (op->Value >= 0)
				&& (op->Value <= 65535L)) {
			op->Mode = ARDisp; /* Make it a data reference     */
			op->Rn = SmallData; /*  through specified register. */
			op->Value -= DataOffset; /* Adjust displacement. */
			op->Hunk = ABSHUNK;
		}
		return; /* Could default to absolute long. */

	} else if (SmallData == -1) { /* Fwd. reference - if not small data, */
		return; /*  leave as absolute long addressing. */

	} else if (Brnch IN AdrModeA) {
		return; /* Branches are handled elsewhere. */

	} else if (!Pass2) { /* Forward reference, pass 1 */
		op->Mode = ARDisp; /* Assume displacement       */
		op->Rn = SmallData; /*  from specified register. */
		op->Hunk = ABSHUNK;
		return;

	} else { /* On pass 2 we know what it is. */

		if (Hunk2 < 0) {
			Error(op->Loc, FwdRef); /* External - must be 32 bits. */
			op->Mode = AbsW; /* Force absolute word anyway. */

		} else if (Hunk2 == CurrHunk) { /* It's in the current hunk. */
			op->Mode = PCDisp; /* Convert to PC relative mode. */
			op->Value -= AddrCnt + pcconv; /* Adjust displacement. */
			op->Hunk = ABSHUNK;
			if (!pcconv || (op->Value < -32768) || (op->Value > 32767))
				Error(op->Loc, FwdRef); /* It doesn't fit! */

		} else if (Hunk2 == ABSHUNK) { /* It's absolute. */
			op->Mode = AbsW; /* It has to fit in a word. */
			if ((op->Value < -32768) || (op->Value > 32767))
				Error(op->Loc, FwdRef); /* It doesn't fit! */

		} else {
			op->Mode = ARDisp; /* Assume data reference        */
			op->Rn = SmallData; /*  through specified register. */
			op->Value -= DataOffset; /* Adjust displacement. */
			if ((op->Value < -32768) || (op->Value > 32767))
				Error(op->Loc, FwdRef); /* It doesn't fit! */
		}
	}
}